

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentHandlers.cpp
# Opt level: O2

error_t ArgumentHandlers::qheur_parse_argument(int key,char *arg,argp_state *state)

{
  void *pvVar1;
  int iVar2;
  ostream *poVar3;
  
  pvVar1 = state->input;
  switch(key) {
  case 1:
    iVar2 = atoi(arg);
    *(bool *)((long)pvVar1 + 0x150) = iVar2 != 0;
    break;
  case 2:
    iVar2 = atoi(arg);
    *(bool *)((long)pvVar1 + 0x151) = iVar2 != 0;
    break;
  case 3:
    iVar2 = atoi(arg);
    *(bool *)((long)pvVar1 + 0x152) = iVar2 != 0;
    break;
  case 4:
    iVar2 = atoi(arg);
    *(long *)((long)pvVar1 + 0x158) = (long)iVar2;
    break;
  default:
    if (key == 0x6c) {
      iVar2 = strcmp(arg,"QMDP");
      if (iVar2 == 0) {
        *(undefined4 *)((long)pvVar1 + 0x14c) = 0;
      }
      else {
        iVar2 = strcmp(arg,"QPOMDP");
        if (iVar2 == 0) {
          *(undefined4 *)((long)pvVar1 + 0x14c) = 1;
        }
        else {
          iVar2 = strcmp(arg,"QBG");
          if (iVar2 != 0) {
            return 7;
          }
          *(undefined4 *)((long)pvVar1 + 0x14c) = 2;
        }
      }
    }
    else if (key == 0x66) {
      iVar2 = strcmp(arg,"QPOMDP");
      if (iVar2 == 0) {
        *(undefined4 *)((long)pvVar1 + 0x148) = 1;
      }
      else {
        iVar2 = strcmp(arg,"QBG");
        if (iVar2 != 0) {
          poVar3 = std::operator<<((ostream *)&std::cerr,
                                   "QHybrid: the heuristic for the first time steps can only be QBG or QPOMDP"
                                  );
          std::endl<char,std::char_traits<char>>(poVar3);
          return 7;
        }
        *(undefined4 *)((long)pvVar1 + 0x148) = 2;
      }
    }
    else if (key == 0x68) {
      iVar2 = atoi(arg);
      *(long *)((long)pvVar1 + 0x140) = (long)iVar2;
    }
    else {
      if (key != 0x51) {
        return 7;
      }
      iVar2 = strcmp(arg,"QMDP");
      if (iVar2 == 0) {
        *(undefined4 *)((long)pvVar1 + 0x138) = 0;
      }
      else {
        iVar2 = strcmp(arg,"QPOMDP");
        if (iVar2 == 0) {
          *(undefined4 *)((long)pvVar1 + 0x138) = 1;
        }
        else {
          iVar2 = strcmp(arg,"QBG");
          if (iVar2 == 0) {
            *(undefined4 *)((long)pvVar1 + 0x138) = 2;
          }
          else {
            iVar2 = strcmp(arg,"QMDPc");
            if (iVar2 == 0) {
              *(undefined4 *)((long)pvVar1 + 0x138) = 3;
            }
            else {
              iVar2 = strcmp(arg,"QPOMDPav");
              if (iVar2 == 0) {
                *(undefined4 *)((long)pvVar1 + 0x138) = 4;
              }
              else {
                iVar2 = strcmp(arg,"QBGav");
                if (iVar2 == 0) {
                  *(undefined4 *)((long)pvVar1 + 0x138) = 5;
                }
                else {
                  iVar2 = strcmp(arg,"QHybrid");
                  if (iVar2 == 0) {
                    *(undefined4 *)((long)pvVar1 + 0x138) = 6;
                  }
                  else {
                    iVar2 = strcmp(arg,"QPOMDPhybrid");
                    if (iVar2 == 0) {
                      *(undefined4 *)((long)pvVar1 + 0x138) = 7;
                    }
                    else {
                      iVar2 = strcmp(arg,"QBGhybrid");
                      if (iVar2 == 0) {
                        *(undefined4 *)((long)pvVar1 + 0x138) = 8;
                      }
                      else {
                        iVar2 = strcmp(arg,"QBGTreeIncPrune");
                        if (iVar2 == 0) {
                          *(undefined4 *)((long)pvVar1 + 0x138) = 9;
                        }
                        else {
                          iVar2 = strcmp(arg,"QBGTreeIncPruneBnB");
                          if (iVar2 != 0) {
                            return 7;
                          }
                          *(undefined4 *)((long)pvVar1 + 0x138) = 10;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

error_t
qheur_parse_argument (int key, char *arg, struct argp_state *state)
{
    /* Get the input argument from argp_parse, which we
      know is a pointer to our arguments structure. */
    struct Arguments* theArgumentsStruc = (struct Arguments*) state->input;

    switch (key)
    {
    case 'Q':
        if(strcmp(arg,"QMDP")==0)
            theArgumentsStruc->qheur=eQMDP;
        else if(strcmp(arg,"QPOMDP")==0)
            theArgumentsStruc->qheur=eQPOMDP;
        else if(strcmp(arg,"QBG")==0)
            theArgumentsStruc->qheur=eQBG;
        else if(strcmp(arg,"QMDPc")==0)
            theArgumentsStruc->qheur=eQMDPc;
        else if(strcmp(arg,"QPOMDPav")==0)
            theArgumentsStruc->qheur=eQPOMDPav;
        else if(strcmp(arg,"QBGav")==0)
            theArgumentsStruc->qheur=eQBGav;
        else if(strcmp(arg,"QHybrid")==0)
            theArgumentsStruc->qheur=eQHybrid;
        else if(strcmp(arg,"QPOMDPhybrid")==0)
            theArgumentsStruc->qheur=eQPOMDPhybrid;
        else if(strcmp(arg,"QBGhybrid")==0)
            theArgumentsStruc->qheur=eQBGhybrid;
        else if(strcmp(arg,"QBGTreeIncPrune")==0)
            theArgumentsStruc->qheur=eQBGTreeIncPrune;
        else if(strcmp(arg,"QBGTreeIncPruneBnB")==0)
            theArgumentsStruc->qheur=eQBGTreeIncPruneBnB;
        else
            return ARGP_ERR_UNKNOWN;
        break;
    case 'h':
        theArgumentsStruc->QHybridHorizonLastTimeSteps = atoi(arg);
        break;
    case 'f':
        if(strcmp(arg,"QPOMDP")==0)
            theArgumentsStruc->QHybridFirstTS=eQPOMDP;
        else if(strcmp(arg,"QBG")==0)
            theArgumentsStruc->QHybridFirstTS=eQBG;
        else
        {
            std::cerr << "QHybrid: the heuristic for the first time steps can only be QBG or QPOMDP" << std::endl;
            return ARGP_ERR_UNKNOWN;
        }
        break;
    case 'l':
        if(strcmp(arg,"QMDP")==0)
            theArgumentsStruc->QHybridLastTS=eQMDP;
        else if(strcmp(arg,"QPOMDP")==0)
            theArgumentsStruc->QHybridLastTS=eQPOMDP;
        else if(strcmp(arg,"QBG")==0)
            theArgumentsStruc->QHybridLastTS=eQBG;
        else
            return ARGP_ERR_UNKNOWN;
        break;
    case PRUNEAFTERUNION:
        theArgumentsStruc->TreeIPpruneAfterUnion=atoi(arg);
        break;
    case PRUNEAFTERCROSSSUM:
        theArgumentsStruc->TreeIPpruneAfterCrossSum=atoi(arg);
        break;
    case TREEIPVECTORCACHE:
        theArgumentsStruc->TreeIPuseVectorCache=atoi(arg);
        break;
    case ACCELERATEDPRUNINGTHRESHOLD:
        theArgumentsStruc->acceleratedPruningThreshold=atoi(arg);
        break;
    default:
        return ARGP_ERR_UNKNOWN;
    }
    return 0;
}